

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.h
# Opt level: O1

void __thiscall
lossless_neural_sound::expression_compiler::expression::Element_variable::write_indexes
          (Element_variable *this,ostream *os)

{
  long lVar1;
  size_t sVar2;
  size_t i;
  long lVar3;
  char *pcVar4;
  
  lVar1 = 0;
  lVar3 = 0;
  do {
    lVar1 = lVar1 + (ulong)((this->matrix_variable->sizes)._M_elems[lVar3] != 1);
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  if (lVar1 == 1) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"[",1);
    os = std::ostream::_M_insert<unsigned_long>((ulong)os);
    pcVar4 = "]";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(os,"(",1);
    lVar1 = 0;
    pcVar4 = "";
    do {
      sVar2 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(os,pcVar4,sVar2);
      std::ostream::_M_insert<unsigned_long>((ulong)os);
      lVar1 = lVar1 + 8;
      pcVar4 = ", ";
    } while (lVar1 != 0x10);
    pcVar4 = ")";
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar4,1);
  return;
}

Assistant:

void write_indexes(std::ostream &os) const
    {
        std::size_t non_unit_dimension_count = 0;
        std::size_t non_unit_dimension_index = 0;
        for(std::size_t i = 0; i < indexes.size(); i++)
        {
            if(matrix_variable->sizes[i] != 1)
            {
                non_unit_dimension_count++;
                non_unit_dimension_index = i;
            }
        }
        if(non_unit_dimension_count == 1)
        {
            os << "[" << indexes[indexes.size() - 1 - non_unit_dimension_index] << "]";
        }
        else
        {
            auto separator = "";
            os << "(";
            for(std::size_t i : indexes)
            {
                os << separator << i;
                separator = ", ";
            }
            os << ")";
        }
    }